

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O1

spv_result_t spvtools::val::CompositesPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  int32_t iVar6;
  spv_result_t sVar7;
  uint32_t uVar8;
  spv_result_t sVar9;
  uint32_t uVar10;
  uint uVar11;
  Op OVar12;
  Instruction *pIVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  DiagnosticStream *pDVar16;
  uint uVar17;
  uint *puVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  size_t sVar22;
  byte bVar23;
  uint32_t member_type;
  uint32_t result_num_cols;
  uint32_t result_component_type;
  uint32_t matrix_component_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t result_num_rows;
  uint32_t matrix_col_type;
  uint32_t local_26c;
  Instruction *local_268;
  ulong local_260;
  undefined8 local_258;
  char *local_250;
  uint local_248;
  _Head_base<2UL,_unsigned_int,_false> local_244;
  uint32_t local_240;
  uint32_t local_23c;
  uint32_t local_238;
  uint32_t local_234;
  string local_230;
  uint32_t local_20c;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  uVar17 = uVar1 - 0x4d;
  if (7 < uVar17) {
    if (uVar1 != 400) {
      return SPV_SUCCESS;
    }
    pIVar13 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar14 = ValidationState_t::FindDef(_,uVar17);
    pIVar14 = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
    if (((pIVar14 == pIVar13) || (pIVar13 == (Instruction *)0x0)) || (pIVar14 == (Instruction *)0x0)
       ) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar20 = "Result Type must not equal the Operand type";
LAB_00662bc1:
      lVar19 = 0x2b;
    }
    else {
      bVar5 = ValidationState_t::LogicallyMatch(_,pIVar14,pIVar13,false);
      if (!bVar5) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "Result Type does not logically match the Operand type";
        goto LAB_00662db9;
      }
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Cannot copy composites of 8- or 16-bit types";
      lVar19 = 0x2c;
    }
    goto LAB_00663722;
  }
  puVar18 = (uint *)((long)&switchD_00662228::switchdataD_007bc7c4 +
                    (long)(int)(&switchD_00662228::switchdataD_007bc7c4)[uVar17]);
  switch((uint)uVar1) {
  case 0x4d:
    uVar8 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
    iVar6 = spvOpcodeIsScalarType(OVar12);
    if (iVar6 == 0) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be a scalar type";
LAB_00662d16:
      lVar19 = 0x28;
    }
    else {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
      if ((OVar12 != OpTypeVector) && (OVar12 != OpTypeCooperativeVectorNV)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Vector type to be OpTypeVector";
        goto LAB_00662e32;
      }
      uVar10 = ValidationState_t::GetComponentType(_,uVar10);
      if (uVar10 == uVar8) {
        uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar13 = ValidationState_t::FindDef(_,uVar17);
        if (((pIVar13 == (Instruction *)0x0) || (uVar8 = (pIVar13->inst_).type_id, uVar8 == 0)) ||
           (bVar5 = ValidationState_t::IsIntScalarType(_,uVar8), !bVar5)) {
LAB_00662d6f:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Index to be int scalar";
          lVar19 = 0x1f;
        }
        else {
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Cannot extract from a vector of 8- or 16-bit types";
          lVar19 = 0x32;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Vector component type to be equal to Result Type";
        lVar19 = 0x39;
      }
    }
    break;
  case 0x4e:
    uVar8 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
    if ((OVar12 == OpTypeVector) || (OVar12 == OpTypeCooperativeVectorNV)) {
      uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
      if (uVar10 == uVar8) {
        uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
        uVar8 = ValidationState_t::GetComponentType(_,uVar8);
        if (uVar8 == uVar10) {
          uVar8 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar5 = ValidationState_t::IsIntScalarType(_,uVar8);
          if (!bVar5) goto LAB_00662d6f;
          bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Cannot insert into a vector of 8- or 16-bit types";
          lVar19 = 0x31;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected Component type to be equal to Result Type ",0x33
                    );
          pcVar20 = "component type";
          lVar19 = 0xe;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Vector type to be equal to Result Type";
        lVar19 = 0x2f;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be OpTypeVector";
LAB_00662e32:
      lVar19 = 0x27;
    }
    break;
  case 0x4f:
    pIVar13 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of OpVectorShuffle must be",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," OpTypeVector. Found Op",0x17);
      local_230._M_dataplus._M_p = spvOpcodeString((uint)(pIVar13->inst_).opcode);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,".",1);
      local_38 = pDVar16->error_;
      goto LAB_00663734;
    }
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
    if (((long)psVar2 - (long)psVar3 >> 4) - 4U != (ulong)uVar17) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "OpVectorShuffle component literals count does not match Result Type <id> ",0x49);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(pIVar13->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"s vector component count.",0x19);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00663734;
    }
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar14 = ValidationState_t::FindDef(_,uVar17);
    pIVar14 = ValidationState_t::FindDef(_,(pIVar14->inst_).type_id);
    uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar15 = ValidationState_t::FindDef(_,uVar17);
    pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar20 = "The type of Vector 1 must be OpTypeVector.";
    }
    else {
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode == 0x17)) {
        sVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
        sVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
        if (sVar7 == sVar9) {
          sVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
          if (sVar7 == sVar9) {
            uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
            uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
            bVar23 = 0x40 < (ulong)((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(inst->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            if ((bool)bVar23) {
              local_268 = (Instruction *)CONCAT44(local_268._4_4_,uVar11 + uVar17);
              local_258 = (ulong)(uVar11 + uVar17);
              sVar22 = 4;
              bVar23 = true;
              do {
                local_260 = CONCAT71(local_260._1_7_,bVar23);
                uVar17 = Instruction::GetOperandAs<unsigned_int>(inst,sVar22);
                if ((uint)local_268 <= uVar17 && uVar17 != 0xffffffff) {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Component index ",0x10);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," is out of bounds for ",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"combined (Vector1 + Vector2) size of ",0x25);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
                  sVar9 = local_38;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  bVar23 = (byte)local_260;
                  break;
                }
                sVar22 = sVar22 + 1;
                bVar23 = sVar22 < (ulong)((long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4);
              } while ((bool)bVar23);
            }
            if ((bVar23 & 1) != 0) {
              return sVar9;
            }
            bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
            if (!bVar5) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Cannot shuffle a vector of 8- or 16-bit types";
            lVar19 = 0x2d;
            break;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = "The Component Type of Vector 2 must be the same as ResultType.";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = "The Component Type of Vector 1 must be the same as ResultType.";
        }
        lVar19 = 0x3e;
        break;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar20 = "The type of Vector 2 must be OpTypeVector.";
    }
    goto LAB_0066366a;
  case 0x50:
    uVar21 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    sVar9 = (inst->inst_).type_id;
    OVar12 = ValidationState_t::GetIdOpcode(_,sVar9);
    uVar17 = (uint)uVar21;
    if ((int)OVar12 < 0x1168) {
      puVar18 = &switchD_006626fd::switchdataD_007bc7e4;
      switch(OVar12) {
      case OpTypeVector:
switchD_006626fd_caseD_17:
        uVar8 = ValidationState_t::GetDimension(_,sVar9);
        uVar10 = ValidationState_t::GetComponentType(_,sVar9);
        local_268 = (Instruction *)CONCAT44(local_268._4_4_,uVar10);
        if (OVar12 == OpTypeVector) {
          if (uVar17 < 4) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar20 = "Expected number of constituents to be at least 2";
            lVar19 = 0x30;
            goto LAB_0066352b;
          }
          local_248 = 0;
          local_244._M_head_impl = uVar8;
        }
        else {
          pIVar13 = ValidationState_t::FindDef(_,sVar9);
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
          ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar11)
          ;
          local_244._M_head_impl = local_208._0_4_;
          local_248 = (uint)CONCAT71((int7)((ulong)puVar18 >> 8),local_208[4]) ^ 1;
        }
        bVar5 = uVar17 >= 3;
        if (uVar17 < 3) {
          local_258 = (ulong)local_258._4_4_ << 0x20;
        }
        else {
          local_260 = uVar21 & 0xffffffff;
          local_258 = (ulong)local_258._4_4_ << 0x20;
          bVar5 = true;
          sVar22 = 2;
          do {
            uVar8 = ValidationState_t::GetOperandTypeId(_,inst,sVar22);
            if (uVar8 == (uint)local_268) {
              local_258 = CONCAT44(local_258._4_4_,(uint32_t)local_258 + 1);
LAB_006633fc:
              bVar4 = true;
            }
            else {
              OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
              if (OVar12 == OpTypeVector) {
                uVar10 = ValidationState_t::GetComponentType(_,uVar8);
                if (uVar10 == (uint)local_268) {
                  uVar8 = ValidationState_t::GetDimension(_,uVar8);
                  local_258 = CONCAT44(local_258._4_4_,(uint32_t)local_258 + uVar8);
                  goto LAB_006633fc;
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Expected Constituents to be scalars or vectors of",
                         0x31);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," the same type as Result Type components",0x28);
              sVar9 = local_38;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar4 = false;
            }
            if (!bVar4) break;
            sVar22 = sVar22 + 1;
            bVar5 = sVar22 < local_260;
          } while (sVar22 != local_260);
        }
        if (bVar5) goto LAB_00663542;
        bVar5 = true;
        if ((char)local_248 == '\0' && local_244._M_head_impl != (uint32_t)local_258) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of given components to be equal ",
                     0x36);
          pcVar20 = "to the size of Result Type vector";
          lVar19 = 0x21;
          goto LAB_0066352b;
        }
        goto LAB_00663544;
      case OpTypeMatrix:
        local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
        local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
        local_26c = 0;
        local_240 = 0;
        bVar5 = ValidationState_t::GetMatrixTypeInfo
                          (_,sVar9,(uint32_t *)&local_230,(uint32_t *)&local_250,&local_26c,
                           &local_240);
        if (!bVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x114,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((uint32_t)local_250 + 2 == uVar17) {
          pIVar14 = (Instruction *)(ulong)(uVar17 < 3);
          if (uVar17 >= 3) {
            pIVar14 = (Instruction *)(3 - (uVar21 & 0xffffffff));
            sVar22 = 2;
            local_268 = pIVar14;
            do {
              uVar8 = ValidationState_t::GetOperandTypeId(_,inst,sVar22);
              pIVar14 = (Instruction *)CONCAT71((int7)((ulong)pIVar14 >> 8),uVar8 == local_26c);
              if (uVar8 != local_26c) {
                local_260 = CONCAT44(local_260._4_4_,(int)pIVar14);
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,
                           "Expected Constituent type to be equal to the column ",0x34);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"type Result Type matrix",0x17);
                sVar9 = local_38;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                pIVar14 = (Instruction *)(local_260 & 0xffffffff);
                break;
              }
              lVar19 = (long)&(local_268->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + sVar22;
              sVar22 = sVar22 + 1;
            } while (lVar19 != 2);
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of Constituents to be equal ",0x32)
          ;
          pcVar20 = "to the number of columns of Result Type matrix";
LAB_006636a8:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar20,0x2e);
          sVar9 = local_38;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          pIVar14 = (Instruction *)0x0;
        }
        break;
      default:
switchD_006626fd_caseD_19:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected Result Type to be a composite type";
        goto LAB_00662bc1;
      case OpTypeArray:
        pIVar13 = ValidationState_t::FindDef(_,sVar9);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("array_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,299,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar13->inst_).opcode != 0x1c) {
          __assert_fail("array_inst->opcode() == spv::Op::OpTypeArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,300,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        pIVar14 = ValidationState_t::FindDef
                            (_,(pIVar13->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[3]);
        iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar14->inst_).opcode);
        if (iVar6 == 0) {
          local_230._M_dataplus._M_p = (char *)0x0;
          bVar5 = ValidationState_t::EvalConstantValUint64
                            (_,(pIVar13->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[3],(uint64_t *)&local_230);
          if (!bVar5) {
            __assert_fail("0 && \"Array type definition is corrupt\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x136,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                         );
          }
          if (local_230._M_dataplus._M_p + 2 != (char *)(uVar21 & 0xffffffff)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Expected total number of Constituents to be equal ",
                       0x32);
            pcVar20 = "to the number of elements of Result Type array";
            goto LAB_006636a8;
          }
          pIVar14 = (Instruction *)(ulong)(uVar17 < 3);
          if (uVar17 >= 3) {
            uVar8 = (pIVar13->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
            local_268 = (Instruction *)(3 - (long)(uVar21 & 0xffffffff));
            sVar22 = 2;
            local_260 = CONCAT44(local_260._4_4_,uVar8);
            do {
              uVar10 = ValidationState_t::GetOperandTypeId(_,inst,sVar22);
              bVar5 = uVar10 == uVar8;
              if (!bVar5) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,
                           "Expected Constituent type to be equal to the column ",0x34);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"type Result Type array",0x16);
                sVar9 = local_38;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                uVar8 = (uint32_t)local_260;
              }
              pIVar14 = (Instruction *)(ulong)bVar5;
            } while ((uVar10 == uVar8) &&
                    (lVar19 = (long)&(local_268->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + sVar22,
                    sVar22 = sVar22 + 1, lVar19 != 2));
          }
        }
        else {
          pIVar14 = (Instruction *)0x1;
        }
        break;
      case OpTypeStruct:
        pIVar13 = ValidationState_t::FindDef(_,sVar9);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("struct_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14e,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if ((pIVar13->inst_).opcode != 0x1e) {
          __assert_fail("struct_inst->opcode() == spv::Op::OpTypeStruct",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x14f,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        if (((long)(pIVar13->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pIVar13->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) + 1U != (uVar21 & 0xffffffff)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Expected total number of Constituents to be equal ",0x32)
          ;
          pcVar20 = "to the number of members of Result Type struct";
          goto LAB_006636a8;
        }
        pIVar14 = (Instruction *)(ulong)(uVar17 < 3);
        if (uVar17 >= 3) {
          local_260 = 3 - (uVar21 & 0xffffffff);
          sVar22 = 2;
          local_268 = pIVar13;
          do {
            pIVar13 = local_268;
            uVar10 = ValidationState_t::GetOperandTypeId(_,inst,sVar22);
            uVar8 = (pIVar13->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar22];
            if (uVar10 != uVar8) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Expected Constituent type to be equal to the ",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"corresponding member type of Result Type struct",0x2f
                        );
              sVar9 = local_38;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            }
            pIVar14 = (Instruction *)(ulong)(uVar10 == uVar8);
          } while ((uVar10 == uVar8) &&
                  (lVar19 = local_260 + sVar22, sVar22 = sVar22 + 1, lVar19 != 2));
        }
      }
      if ((char)pIVar14 == '\0') {
        return sVar9;
      }
    }
    else {
      if (OVar12 == OpTypeCooperativeMatrixKHR) {
        pIVar13 = ValidationState_t::FindDef(_,sVar9);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x166,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
        if (uVar17 == 3) {
LAB_006631bf:
          uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
          bVar5 = uVar8 == uVar11;
          if (bVar5) goto LAB_00663544;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Expected Constituent type to be equal to the component type";
          lVar19 = 0x3b;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar20 = "Must be only one constituent";
          lVar19 = 0x1c;
        }
      }
      else {
        if (OVar12 != OpTypeCooperativeMatrixNV) {
          if (OVar12 != OpTypeCooperativeVectorNV) goto switchD_006626fd_caseD_19;
          goto switchD_006626fd_caseD_17;
        }
        pIVar13 = ValidationState_t::FindDef(_,sVar9);
        if (pIVar13 == (Instruction *)0x0) {
          __assert_fail("result_type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x179,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCompositeConstruct(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
        if (uVar17 == 3) goto LAB_006631bf;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Expected single constituent";
        lVar19 = 0x1b;
      }
LAB_0066352b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar20,lVar19);
      sVar9 = local_38;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00663542:
      bVar5 = false;
LAB_00663544:
      if (!bVar5) {
        return sVar9;
      }
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar20 = "Cannot create a composite containing 8- or 16-bit types";
    lVar19 = 0x37;
    break;
  case 0x51:
    local_26c = 0;
    sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_26c);
    uVar10 = local_26c;
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    uVar8 = (inst->inst_).type_id;
    if (uVar8 != local_26c) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Result type (Op",0xf)
      ;
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar12);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      pcVar20 = ") does not match the type that results from indexing into the composite (Op";
LAB_006632ed:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,pcVar20,0x4b);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar10);
      local_250 = spvOpcodeString(OVar12);
      pDVar16 = DiagnosticStream::operator<<(pDVar16,&local_250);
      pcVar20 = ").";
      lVar19 = 2;
      goto LAB_0066332d;
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
    if (!bVar5) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar20 = "Cannot extract from a composite of 8- or 16-bit types";
LAB_00662db9:
    lVar19 = 0x35;
    break;
  case 0x52:
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if ((inst->inst_).type_id == uVar10) {
      local_26c = 0;
      sVar9 = anon_unknown_1::GetExtractInsertValueType(_,inst,&local_26c);
      uVar10 = local_26c;
      if (sVar9 != SPV_SUCCESS) {
        return sVar9;
      }
      if (uVar8 == local_26c) {
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar20 = "Cannot insert into a composite of 8- or 16-bit types";
        goto LAB_00662c68;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Object type (Op",0x13);
      OVar12 = ValidationState_t::GetIdOpcode(_,uVar8);
      local_230._M_dataplus._M_p = spvOpcodeString(OVar12);
      pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
      pcVar20 = ") does not match the type that results from indexing into the Composite (Op";
      goto LAB_006632ed;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type must be the same as Composite type in Op",0x38)
    ;
    local_230._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar16 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar16," yielding Result Id ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
    pcVar20 = ".";
    lVar19 = 1;
LAB_0066332d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,pcVar20,lVar19);
    local_38 = pDVar16->error_;
    goto LAB_00663734;
  case 0x53:
    uVar8 = (inst->inst_).type_id;
    uVar10 = ValidationState_t::GetOperandTypeId(_,inst,2);
    if (uVar10 == uVar8) {
      bVar5 = ValidationState_t::IsVoidType(_,uVar8);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "OpCopyObject cannot have void result type";
LAB_00663287:
      lVar19 = 0x29;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type and Operand type to be the same";
LAB_00662c68:
      lVar19 = 0x34;
    }
    break;
  case 0x54:
    local_230._M_dataplus._M_p = local_230._M_dataplus._M_p & 0xffffffff00000000;
    local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
    local_26c = 0;
    local_240 = 0;
    bVar5 = ValidationState_t::GetMatrixTypeInfo
                      (_,(inst->inst_).type_id,(uint32_t *)&local_230,(uint32_t *)&local_250,
                       &local_26c,&local_240);
    if (!bVar5) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Result Type to be a matrix type";
      goto LAB_00662d16;
    }
    uVar8 = ValidationState_t::GetOperandTypeId(_,inst,2);
    local_234 = 0;
    local_238 = 0;
    local_20c = 0;
    local_23c = 0;
    bVar5 = ValidationState_t::GetMatrixTypeInfo
                      (_,uVar8,&local_234,&local_238,&local_20c,&local_23c);
    if (bVar5) {
      if (local_240 != local_23c) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected component types of Matrix and Result Type to be ",
                   0x39);
        pcVar20 = "identical";
        lVar19 = 9;
        break;
      }
      if (((uint32_t)local_230._M_dataplus._M_p != local_238) || ((uint32_t)local_250 != local_234))
      {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected number of columns and the column size of Matrix ",
                   0x39);
        pcVar20 = "to be the reverse of those of Result Type";
        goto LAB_00663287;
      }
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      bVar5 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id);
      if (!bVar5) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Cannot transpose matrices of 16-bit floats";
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar20 = "Expected Matrix to be of type OpTypeMatrix";
    }
LAB_0066366a:
    lVar19 = 0x2a;
  }
LAB_00663722:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar20,lVar19);
LAB_00663734:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t CompositesPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVectorExtractDynamic:
      return ValidateVectorExtractDynamic(_, inst);
    case spv::Op::OpVectorInsertDynamic:
      return ValidateVectorInsertDyanmic(_, inst);
    case spv::Op::OpVectorShuffle:
      return ValidateVectorShuffle(_, inst);
    case spv::Op::OpCompositeConstruct:
      return ValidateCompositeConstruct(_, inst);
    case spv::Op::OpCompositeExtract:
      return ValidateCompositeExtract(_, inst);
    case spv::Op::OpCompositeInsert:
      return ValidateCompositeInsert(_, inst);
    case spv::Op::OpCopyObject:
      return ValidateCopyObject(_, inst);
    case spv::Op::OpTranspose:
      return ValidateTranspose(_, inst);
    case spv::Op::OpCopyLogical:
      return ValidateCopyLogical(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}